

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::SortImports::ImportElem::ImportElem
          (ImportElem *this,UString *key,Fodder *adjacentFodder,Bind *bind)

{
  pointer pcVar1;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)this,pcVar1,pcVar1 + key->_M_string_length);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->adjacentFodder,adjacentFodder);
  Local::Bind::Bind(&this->bind,bind);
  return;
}

Assistant:

ImportElem(UString key, Fodder adjacentFodder, Local::Bind bind)
            : key(key), adjacentFodder(adjacentFodder), bind(bind)
        {
        }